

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall capnp::compiler::Compiler::Impl::~Impl(Impl *this)

{
  Impl *this_local;
  
  ~Impl(this);
  operator_delete(this,0x288);
  return;
}

Assistant:

Compiler::Impl::~Impl() noexcept(false) {}